

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_relocation.hpp
# Opt level: O0

bool __thiscall
ELFIO::relocation_section_accessor_template<ELFIO::section>::
generic_get_entry_rela<ELFIO::Elf32_Rela>
          (relocation_section_accessor_template<ELFIO::section> *this,Elf_Xword index,
          Elf64_Addr *offset,Elf_Word *symbol,uint *type,Elf_Sxword *addend)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  Elf_Word EVar4;
  uint uVar5;
  int32_t iVar6;
  endianness_convertor *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint32_t *puVar7;
  bool bVar8;
  Elf_Xword tmp;
  Elf32_Rela *pEntry;
  endianness_convertor *convertor;
  Elf_Sxword *addend_local;
  uint *type_local;
  Elf_Word *symbol_local;
  Elf64_Addr *offset_local;
  Elf_Xword index_local;
  relocation_section_accessor_template<ELFIO::section> *this_local;
  
  this_00 = elfio::get_convertor(this->elf_file);
  iVar1 = (*this->relocation_section->_vptr_section[0xf])();
  bVar8 = 0xb < CONCAT44(extraout_var,iVar1);
  if (bVar8) {
    iVar1 = (*this->relocation_section->_vptr_section[0x18])();
    iVar2 = (*this->relocation_section->_vptr_section[0xf])();
    puVar7 = (uint32_t *)(CONCAT44(extraout_var_00,iVar1) + index * CONCAT44(extraout_var_01,iVar2))
    ;
    uVar3 = endianness_convertor::operator()(this_00,*puVar7);
    *offset = (ulong)uVar3;
    uVar3 = endianness_convertor::operator()(this_00,puVar7[1]);
    EVar4 = get_sym_and_type<ELFIO::Elf32_Rela>::get_r_sym((ulong)uVar3);
    *symbol = EVar4;
    uVar5 = get_sym_and_type<ELFIO::Elf32_Rela>::get_r_type((ulong)uVar3);
    *type = uVar5;
    iVar6 = endianness_convertor::operator()(this_00,puVar7[2]);
    *addend = (long)iVar6;
  }
  return bVar8;
}

Assistant:

bool generic_get_entry_rela( Elf_Xword   index,
                                 Elf64_Addr& offset,
                                 Elf_Word&   symbol,
                                 unsigned&   type,
                                 Elf_Sxword& addend ) const
    {
        const endianness_convertor& convertor = elf_file.get_convertor();

        if ( relocation_section->get_entry_size() < sizeof( T ) ) {
            return false;
        }

        const T* pEntry = reinterpret_cast<const T*>(
            relocation_section->get_data() +
            index * relocation_section->get_entry_size() );
        offset        = convertor( pEntry->r_offset );
        Elf_Xword tmp = convertor( pEntry->r_info );
        symbol        = get_sym_and_type<T>::get_r_sym( tmp );
        type          = get_sym_and_type<T>::get_r_type( tmp );
        addend        = convertor( pEntry->r_addend );
        return true;
    }